

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O1

void __thiscall
TestRegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists::Run
          (TestRegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  undefined8 uVar5;
  int iVar6;
  runtime_error *this_00;
  bool bVar7;
  string expectedOutput;
  path p_2;
  TemporaryWorkingDirectory workdir;
  ostringstream oss;
  Component comp;
  path local_4c8;
  path local_4a8;
  path local_488;
  path local_468;
  path local_448;
  TemporaryWorkingDirectory local_428;
  undefined1 local_3e8 [112];
  ios_base local_378 [264];
  undefined1 local_270 [8];
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [14];
  ios_base local_178 [328];
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory(&local_428,(this->super_Test).name);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3e8 + 0x10);
  local_3e8._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"MyComponent","");
  local_270 = (undefined1  [8])local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_428.workDir.m_pathname._M_dataplus._M_p,
             local_428.workDir.m_pathname._M_dataplus._M_p +
             local_428.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=((path *)local_270,(path *)local_3e8);
  boost::filesystem::detail::create_directories((path *)local_270,(error_code *)0x0);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  paVar1 = &local_4c8.m_pathname.field_2;
  local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"MyComponent","");
  local_3e8._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,local_428.workDir.m_pathname._M_dataplus._M_p,
             local_428.workDir.m_pathname._M_dataplus._M_p +
             local_428.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=((path *)local_3e8,&local_4c8);
  paVar2 = &local_4a8.m_pathname.field_2;
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"SubComponentA","");
  boost::filesystem::path::operator/=((path *)local_3e8,&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ == paVar3) {
    local_260[0]._8_8_ = local_3e8._24_8_;
    local_270 = (undefined1  [8])local_260;
  }
  else {
    local_270 = (undefined1  [8])local_3e8._0_8_;
  }
  local_268 = local_3e8._8_8_;
  local_3e8._8_8_ = 0;
  local_3e8._16_8_ = local_3e8._16_8_ & 0xffffffffffffff00;
  local_3e8._0_8_ = paVar3;
  boost::filesystem::detail::create_directories((path *)local_270,(error_code *)0x0);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.m_pathname._M_dataplus._M_p);
  }
  local_448.m_pathname._M_dataplus._M_p = (pointer)&local_448.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"MyComponent","");
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,local_428.workDir.m_pathname._M_dataplus._M_p,
             local_428.workDir.m_pathname._M_dataplus._M_p +
             local_428.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=(&local_4a8,&local_448);
  local_468.m_pathname._M_dataplus._M_p = (pointer)&local_468.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"SubComponentA","");
  boost::filesystem::path::operator/=(&local_4a8,&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p == paVar2) {
    local_4c8.m_pathname.field_2._8_4_ = local_4a8.m_pathname.field_2._8_4_;
    local_4c8.m_pathname.field_2._12_4_ = local_4a8.m_pathname.field_2._12_4_;
    local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4c8.m_pathname._M_dataplus._M_p = local_4a8.m_pathname._M_dataplus._M_p;
  }
  local_4c8.m_pathname.field_2._M_allocated_capacity._4_4_ =
       local_4a8.m_pathname.field_2._M_allocated_capacity._4_4_;
  local_4c8.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_4a8.m_pathname.field_2._M_allocated_capacity._0_4_;
  local_4c8.m_pathname._M_string_length = local_4a8.m_pathname._M_string_length;
  local_4a8.m_pathname._M_string_length = 0;
  local_4a8.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_4a8.m_pathname.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_488.m_pathname._M_dataplus._M_p = (pointer)&local_488.m_pathname.field_2;
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"CMakeLists.txt","");
  boost::filesystem::path::operator/=(&local_4c8,&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p == paVar1) {
    local_3e8._24_8_ =
         CONCAT44(local_4c8.m_pathname.field_2._12_4_,local_4c8.m_pathname.field_2._8_4_);
    local_3e8._0_8_ = paVar3;
  }
  else {
    local_3e8._0_8_ = local_4c8.m_pathname._M_dataplus._M_p;
  }
  local_3e8._16_8_ = local_4c8.m_pathname.field_2._M_allocated_capacity;
  local_3e8._8_8_ = local_4c8.m_pathname._M_string_length;
  local_4c8.m_pathname._M_string_length = 0;
  local_4c8.m_pathname.field_2._M_allocated_capacity =
       local_4c8.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::ofstream::ofstream(local_270,(char *)local_3e8._0_8_,_S_out);
  std::ofstream::close();
  uVar5 = _sentry;
  pcVar4 = _VTT;
  local_270 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_270 + *(long *)(_VTT + -0x18)) = _sentry;
  std::filebuf::~filebuf((filebuf *)&local_268);
  std::ios_base::~ios_base(local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_pathname._M_dataplus._M_p != &local_488.m_pathname.field_2) {
    operator_delete(local_488.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.m_pathname._M_dataplus._M_p != &local_468.m_pathname.field_2) {
    operator_delete(local_468.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.m_pathname._M_dataplus._M_p != &local_448.m_pathname.field_2) {
    operator_delete(local_448.m_pathname._M_dataplus._M_p);
  }
  local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"MyComponent","");
  local_3e8._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,local_428.workDir.m_pathname._M_dataplus._M_p,
             local_428.workDir.m_pathname._M_dataplus._M_p +
             local_428.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=((path *)local_3e8,&local_4c8);
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"SubComponentB","");
  boost::filesystem::path::operator/=((path *)local_3e8,&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ == paVar3) {
    local_260[0]._8_8_ = local_3e8._24_8_;
    local_270 = (undefined1  [8])local_260;
  }
  else {
    local_270 = (undefined1  [8])local_3e8._0_8_;
  }
  local_268 = local_3e8._8_8_;
  local_3e8._8_8_ = 0;
  local_3e8._16_8_ = local_3e8._16_8_ & 0xffffffffffffff00;
  local_3e8._0_8_ = paVar3;
  boost::filesystem::detail::create_directories((path *)local_270,(error_code *)0x0);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.m_pathname._M_dataplus._M_p);
  }
  local_448.m_pathname._M_dataplus._M_p = (pointer)&local_448.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"MyComponent","");
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,local_428.workDir.m_pathname._M_dataplus._M_p,
             local_428.workDir.m_pathname._M_dataplus._M_p +
             local_428.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=(&local_4a8,&local_448);
  local_468.m_pathname._M_dataplus._M_p = (pointer)&local_468.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"SubComponentB","");
  boost::filesystem::path::operator/=(&local_4a8,&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p == paVar2) {
    local_4c8.m_pathname.field_2._8_4_ = local_4a8.m_pathname.field_2._8_4_;
    local_4c8.m_pathname.field_2._12_4_ = local_4a8.m_pathname.field_2._12_4_;
    local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_4c8.m_pathname._M_dataplus._M_p = local_4a8.m_pathname._M_dataplus._M_p;
  }
  local_4c8.m_pathname.field_2._M_allocated_capacity._4_4_ =
       local_4a8.m_pathname.field_2._M_allocated_capacity._4_4_;
  local_4c8.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_4a8.m_pathname.field_2._M_allocated_capacity._0_4_;
  local_4c8.m_pathname._M_string_length = local_4a8.m_pathname._M_string_length;
  local_4a8.m_pathname._M_string_length = 0;
  local_4a8.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_4a8.m_pathname.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_488.m_pathname._M_dataplus._M_p = (pointer)&local_488.m_pathname.field_2;
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"CMakeLists.txt","");
  boost::filesystem::path::operator/=(&local_4c8,&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p == paVar1) {
    local_3e8._24_8_ =
         CONCAT44(local_4c8.m_pathname.field_2._12_4_,local_4c8.m_pathname.field_2._8_4_);
    local_3e8._0_8_ = paVar3;
  }
  else {
    local_3e8._0_8_ = local_4c8.m_pathname._M_dataplus._M_p;
  }
  local_3e8._16_8_ = local_4c8.m_pathname.field_2._M_allocated_capacity;
  local_3e8._8_8_ = local_4c8.m_pathname._M_string_length;
  local_4c8.m_pathname._M_string_length = 0;
  local_4c8.m_pathname.field_2._M_allocated_capacity =
       local_4c8.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::ofstream::ofstream(local_270,(char *)local_3e8._0_8_,_S_out);
  std::ofstream::close();
  local_270 = (undefined1  [8])pcVar4;
  *(undefined8 *)(local_270 + *(long *)(pcVar4 + -0x18)) = uVar5;
  std::filebuf::~filebuf((filebuf *)&local_268);
  std::ios_base::~ios_base(local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_pathname._M_dataplus._M_p != &local_488.m_pathname.field_2) {
    operator_delete(local_488.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.m_pathname._M_dataplus._M_p != &local_468.m_pathname.field_2) {
    operator_delete(local_468.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.m_pathname._M_dataplus._M_p != &local_448.m_pathname.field_2) {
    operator_delete(local_448.m_pathname._M_dataplus._M_p);
  }
  local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"MyComponent","");
  local_3e8._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,local_428.workDir.m_pathname._M_dataplus._M_p,
             local_428.workDir.m_pathname._M_dataplus._M_p +
             local_428.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=((path *)local_3e8,&local_4c8);
  local_4a8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Data","");
  boost::filesystem::path::operator/=((path *)local_3e8,&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ == paVar3) {
    local_260[0]._8_8_ = local_3e8._24_8_;
    local_270 = (undefined1  [8])local_260;
  }
  else {
    local_270 = (undefined1  [8])local_3e8._0_8_;
  }
  local_260[0]._M_allocated_capacity = local_3e8._16_8_;
  local_268 = local_3e8._8_8_;
  local_3e8._8_8_ = 0;
  local_3e8._16_8_ = local_3e8._16_8_ & 0xffffffffffffff00;
  local_3e8._0_8_ = paVar3;
  boost::filesystem::detail::create_directories((path *)local_270,(error_code *)0x0);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c8.m_pathname._M_dataplus._M_p);
  }
  local_3e8._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"./MyComponent/","");
  Component::Component((Component *)local_270,(path *)local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != paVar3) {
    operator_delete((void *)local_3e8._0_8_);
  }
  local_4c8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c8,
             "add_subdirectory(SubComponentA)\nadd_subdirectory(SubComponentB)\n","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  RegenerateCmakeAddSubdirectory((ostream *)local_3e8,(Component *)local_270);
  std::__cxx11::stringbuf::str();
  if (local_4a8.m_pathname._M_string_length == local_4c8.m_pathname._M_string_length) {
    if (local_4a8.m_pathname._M_string_length == 0) {
      bVar7 = true;
    }
    else {
      iVar6 = bcmp(local_4a8.m_pathname._M_dataplus._M_p,local_4c8.m_pathname._M_dataplus._M_p,
                   local_4a8.m_pathname._M_string_length);
      bVar7 = iVar6 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_4a8.m_pathname._M_dataplus._M_p);
  }
  if (bVar7) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
    std::ios_base::~ios_base(local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_4c8.m_pathname._M_dataplus._M_p);
    }
    Component::~Component((Component *)local_270);
    TemporaryWorkingDirectory::~TemporaryWorkingDirectory(&local_428);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");
  filesystem::create_directories(workdir() / "MyComponent" / "SubComponentA");
  std::ofstream((workdir() / "MyComponent" / "SubComponentA" / "CMakeLists.txt").c_str()).close();
  filesystem::create_directories(workdir() / "MyComponent" / "SubComponentB");
  std::ofstream((workdir() / "MyComponent" / "SubComponentB" / "CMakeLists.txt").c_str()).close();
  filesystem::create_directories(workdir() / "MyComponent" / "Data");

  Component comp("./MyComponent/");

  const std::string expectedOutput(
    "add_subdirectory(SubComponentA)\n"
    "add_subdirectory(SubComponentB)\n");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}